

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.hpp
# Opt level: O1

uint __thiscall
rc::detail::BitStream<rc::Random>::next<unsigned_int>(BitStream<rc::Random> *this,uint nbits)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  Number NVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar9 = 0x20;
  if ((int)nbits < 0x20) {
    uVar9 = nbits;
  }
  if ((int)nbits < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    uVar7 = uVar9;
    do {
      if (this->m_numBits == 0) {
        NVar4 = Random::next(&this->m_source);
        this->m_bits = NVar4;
        this->m_numBits = this->m_numBits + 0x40;
      }
      uVar8 = this->m_numBits;
      uVar3 = uVar8;
      if ((int)uVar7 < (int)uVar8) {
        uVar3 = uVar7;
      }
      uVar1 = this->m_bits;
      uVar6 = ~(uint)(-1L << ((byte)uVar3 & 0x3f));
      if (0x3f < (int)uVar3) {
        uVar6 = 0xffffffff;
      }
      if (uVar3 < 0x40) {
        this->m_bits = uVar1 >> ((byte)uVar3 & 0x3f);
      }
      uVar5 = uVar5 | ((uint)uVar1 & uVar6) << ((char)uVar9 - (char)uVar7 & 0x3fU);
      this->m_numBits = uVar8 - uVar3;
      uVar8 = uVar7 - uVar3;
      bVar2 = (int)uVar3 <= (int)uVar7;
      uVar7 = uVar8;
    } while (uVar8 != 0 && bVar2);
  }
  return uVar5;
}

Assistant:

T BitStream<Source>::next(int nbits, std::false_type) {
  using SourceType = decltype(m_source.next());
  nbits = std::min(nbits, numBits<T>());

  if (nbits == 0) {
    return 0;
  }

  T value = 0;
  int wantBits = nbits;
  while (wantBits > 0) {
    // Out of bits, refill
    if (m_numBits == 0) {
      m_bits = m_source.next();
      m_numBits += numBits<SourceType>();
    }

    const auto n = std::min(m_numBits, wantBits);
    const auto bits = m_bits & bitMask<SourceType>(n);
    value |= (bits << (nbits - wantBits));
    // To avoid right-shifting data beyond the width of the given type (which is
    // undefined behavior, because of course it is) only perform this shift-
    // assignment if we have room.
    if (static_cast<SourceType>(n) <
        static_cast<SourceType>(numBits<SourceType>())) {
      m_bits >>= static_cast<SourceType>(n);
    }
    m_numBits -= n;
    wantBits -= n;
  }

  if (std::is_signed<T>::value) {
    T signBit = static_cast<T>(0x1) << static_cast<T>(nbits - 1);
    if ((value & signBit) != 0) {
      // For signed values, we use the last bit as the sign bit. Since this
      // was 1, mask away by setting all bits above this one to 1 to make it a
      // negative number in 2's complement
      value |= ~bitMask<T>(nbits);
    }
  }

  return value;
}